

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O0

int tidySetErrorSink(TidyDoc tdoc,TidyOutputSink *sink)

{
  undefined8 uVar1;
  undefined8 uVar2;
  StreamOut *pSVar3;
  uint nl;
  uint outenc;
  TidyDocImpl *impl;
  TidyOutputSink *sink_local;
  TidyDoc tdoc_local;
  
  if (tdoc == (TidyDoc)0x0) {
    tdoc_local._4_4_ = -0x16;
  }
  else {
    uVar1 = *(undefined8 *)(tdoc + 0x94);
    uVar2 = *(undefined8 *)(tdoc + 0x8e);
    prvTidyReleaseStreamOut((TidyDocImpl *)tdoc,*(StreamOut **)(tdoc + 0xcfa));
    pSVar3 = prvTidyUserOutput((TidyDocImpl *)tdoc,sink,(int)uVar1,(uint)uVar2);
    *(StreamOut **)(tdoc + 0xcfa) = pSVar3;
    tdoc_local._4_4_ = -0xc;
    if (*(long *)(tdoc + 0xcfa) != 0) {
      tdoc_local._4_4_ = 0;
    }
  }
  return tdoc_local._4_4_;
}

Assistant:

int TIDY_CALL    tidySetErrorSink( TidyDoc tdoc, TidyOutputSink* sink )
{
    TidyDocImpl* impl = tidyDocToImpl( tdoc );
    if ( impl )
    {
        uint outenc = cfg( impl, TidyOutCharEncoding );
        uint nl = cfg( impl, TidyNewline );
        TY_(ReleaseStreamOut)( impl, impl->errout );
        impl->errout = TY_(UserOutput)( impl, sink, outenc, nl );
        return ( impl->errout ? 0 : -ENOMEM );
    }
    return -EINVAL;
}